

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O3

QColormap * __thiscall QColormap::operator=(QColormap *this,QColormap *colormap)

{
  QColormapPrivate *pQVar1;
  QColormapPrivate *pQVar2;
  
  pQVar1 = colormap->d;
  if (this->d != pQVar1) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar2 = this->d;
    LOCK();
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      operator_delete(this->d,0x10);
    }
    this->d = pQVar1;
  }
  return this;
}

Assistant:

QColormap &QColormap::operator=(const QColormap &colormap)
{ qAtomicAssign(d, colormap.d); return *this; }